

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::TimingPathSymbol::checkDuplicatePaths
          (TimingPathSymbol *this,TimingPathMap *timingPathMap)

{
  char *pcVar1;
  undefined4 uVar2;
  size_t sVar3;
  Expression *this_00;
  TimingPathSymbol *this_01;
  Expression *this_02;
  Expression *this_03;
  Expression *pEVar4;
  Expression *pEVar5;
  uint uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  bool bVar11;
  bool bVar12;
  _Storage<slang::ConstantRange,_true> _Var13;
  ulong uVar14;
  _Storage<slang::ConstantRange,_true> _Var15;
  Diagnostic *pDVar16;
  pointer ppEVar17;
  undefined8 *puVar18;
  uint uVar19;
  EvalContext *context;
  _Storage<slang::ConstantRange,_true> _Var20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  byte bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  optional<slang::ConstantRange> oVar33;
  locator res;
  Symbol *input;
  Symbol *output;
  _Storage<slang::ConstantRange,_true> local_458;
  byte local_450;
  Expression *local_448;
  _Storage<slang::ConstantRange,_true> local_440;
  byte local_438;
  long local_430;
  TimingPathSymbol *local_428;
  _Storage<slang::ConstantRange,_true> local_420;
  _Storage<slang::ConstantRange,_true> local_418;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>
  *local_410;
  pointer local_408;
  pointer local_400;
  pointer local_3f8;
  pointer local_3f0;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
  *local_3e8;
  long local_3e0;
  long local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  Scope *local_3c0;
  pointer local_3b8;
  pointer local_3b0;
  char local_3a8;
  char cStack_3a7;
  char cStack_3a6;
  byte bStack_3a5;
  char cStack_3a4;
  char cStack_3a3;
  char cStack_3a2;
  byte bStack_3a1;
  char cStack_3a0;
  char cStack_39f;
  char cStack_39e;
  byte bStack_39d;
  char cStack_39c;
  char cStack_39b;
  char cStack_39a;
  byte bStack_399;
  char local_398;
  char cStack_397;
  char cStack_396;
  byte bStack_395;
  char cStack_394;
  char cStack_393;
  char cStack_392;
  byte bStack_391;
  char cStack_390;
  char cStack_38f;
  char cStack_38e;
  byte bStack_38d;
  char cStack_38c;
  char cStack_38b;
  char cStack_38a;
  byte bStack_389;
  undefined1 local_380 [40];
  undefined1 local_358 [16];
  bitmask<slang::ast::EvalFlags> local_348;
  undefined1 local_344 [16];
  undefined4 local_334;
  SmallVectorBase<slang::ast::EvalContext::Frame> local_330;
  LValue **local_278;
  size_type local_270;
  size_type local_268;
  LValue *local_260 [5];
  SmallVectorBase<slang::Diagnostic> local_238;
  SmallVectorBase<slang::Diagnostic> local_140;
  SourceRange local_48;
  bool local_38;
  
  local_3c0 = (this->super_Symbol).parentScope;
  local_380._24_16_ = (undefined1  [16])0x0;
  local_358 = (undefined1  [16])0x0;
  local_380._8_4_ = 0xffffffff;
  local_380._16_8_ = 0;
  local_348.m_bits = '\x02';
  local_330.data_ = (pointer)local_330.firstElement;
  local_344 = (undefined1  [16])0x0;
  local_334 = 0;
  local_330.len = 0;
  local_330.cap = 2;
  local_278 = local_260;
  local_270 = 0;
  local_268 = 5;
  local_238.data_ = (pointer)local_238.firstElement;
  local_238.len = 0;
  local_238.cap = 2;
  local_140.data_ = (pointer)local_140.firstElement;
  local_140.len = 0;
  local_140.cap = 2;
  local_48.startLoc = (SourceLocation)0x0;
  local_48.endLoc = (SourceLocation)0x0;
  local_38 = false;
  _Var13 = (_Storage<slang::ConstantRange,_true>)timingPathMap;
  local_380._0_8_ = local_3c0;
  if (this->isResolved == false) {
    resolve(this);
  }
  sVar3 = (this->outputs)._M_extent._M_extent_value;
  if (sVar3 != 0) {
    ppEVar17 = (this->outputs)._M_ptr;
    local_408 = ppEVar17 + sVar3;
    local_3e8 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
                 *)timingPathMap;
    do {
      local_448 = *ppEVar17;
      local_400 = ppEVar17;
      _Var13 = (_Storage<slang::ConstantRange,_true>)Expression::getSymbolReference(local_448,true);
      local_418 = _Var13;
      if (_Var13 != (_Storage<slang::ConstantRange,_true>)0x0) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = _Var13;
        uVar22 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar14 = uVar22 >> ((byte)*(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
                                    *)timingPathMap & 0x3f);
        uVar2 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar22 & 0xff];
        uVar25 = 0;
        uVar24 = uVar14;
        do {
          pcVar1 = (char *)(*(long *)((long)timingPathMap + 0x10) + uVar24 * 0x10);
          local_398 = *pcVar1;
          cStack_397 = pcVar1[1];
          cStack_396 = pcVar1[2];
          bStack_395 = pcVar1[3];
          cStack_394 = pcVar1[4];
          cStack_393 = pcVar1[5];
          cStack_392 = pcVar1[6];
          bStack_391 = pcVar1[7];
          cStack_390 = pcVar1[8];
          cStack_38f = pcVar1[9];
          cStack_38e = pcVar1[10];
          bStack_38d = pcVar1[0xb];
          cStack_38c = pcVar1[0xc];
          cStack_38b = pcVar1[0xd];
          cStack_38a = pcVar1[0xe];
          bStack_389 = pcVar1[0xf];
          cVar27 = (char)uVar2;
          auVar31[0] = -(local_398 == cVar27);
          cVar28 = (char)((uint)uVar2 >> 8);
          auVar31[1] = -(cStack_397 == cVar28);
          cVar29 = (char)((uint)uVar2 >> 0x10);
          auVar31[2] = -(cStack_396 == cVar29);
          bVar30 = (byte)((uint)uVar2 >> 0x18);
          auVar31[3] = -(bStack_395 == bVar30);
          auVar31[4] = -(cStack_394 == cVar27);
          auVar31[5] = -(cStack_393 == cVar28);
          auVar31[6] = -(cStack_392 == cVar29);
          auVar31[7] = -(bStack_391 == bVar30);
          auVar31[8] = -(cStack_390 == cVar27);
          auVar31[9] = -(cStack_38f == cVar28);
          auVar31[10] = -(cStack_38e == cVar29);
          auVar31[0xb] = -(bStack_38d == bVar30);
          auVar31[0xc] = -(cStack_38c == cVar27);
          auVar31[0xd] = -(cStack_38b == cVar28);
          auVar31[0xe] = -(cStack_38a == cVar29);
          auVar31[0xf] = -(bStack_389 == bVar30);
          uVar19 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
          if (uVar19 != 0) {
            lVar23 = *(long *)((long)timingPathMap + 0x18) + uVar24 * 0x348;
            do {
              uVar6 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                }
              }
              if (_Var13 == *(_Storage<slang::ConstantRange,_true> *)(lVar23 + (ulong)uVar6 * 0x38))
              {
                lVar23 = lVar23 + (ulong)uVar6 * 0x38;
                goto LAB_00374709;
              }
              uVar19 = uVar19 - 1 & uVar19;
            } while (uVar19 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7] & bStack_389) == 0)
          break;
          lVar23 = uVar24 + uVar25;
          uVar25 = uVar25 + 1;
          uVar24 = lVar23 + 1U & *(ulong *)((long)timingPathMap + 8);
        } while (uVar25 <= *(ulong *)((long)timingPathMap + 8));
        if (*(ulong *)((long)timingPathMap + 0x28) < *(ulong *)((long)timingPathMap + 0x20)) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
                    ((locator *)&local_440._M_value,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
                      *)timingPathMap,(arrays_type *)timingPathMap,uVar14,uVar22,
                     (try_emplace_args_t *)&local_458._M_value,(Symbol **)&local_418);
          *(long *)((long)timingPathMap + 0x28) = *(long *)((long)timingPathMap + 0x28) + 1;
          lVar23 = local_430;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
                    ((locator *)&local_440._M_value,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
                      *)timingPathMap,uVar22,(try_emplace_args_t *)&local_458._M_value,
                     (Symbol **)&local_418);
          lVar23 = local_430;
        }
LAB_00374709:
        _Var13 = (_Storage<slang::ConstantRange,_true>)local_380;
        oVar33 = Expression::evalSelector(local_448,(EvalContext *)_Var13,false);
        local_458 = oVar33.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload;
        local_450 = oVar33.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_engaged;
        if (this->isResolved == false) {
          resolve(this);
        }
        sVar3 = (this->inputs)._M_extent._M_extent_value;
        if (sVar3 != 0) {
          local_410 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>
                       *)(lVar23 + 8);
          ppEVar17 = (this->inputs)._M_ptr;
          local_3f8 = ppEVar17 + sVar3;
          local_3e0 = lVar23;
          do {
            this_00 = *ppEVar17;
            local_3f0 = ppEVar17;
            _Var13 = (_Storage<slang::ConstantRange,_true>)
                     Expression::getSymbolReference(this_00,true);
            local_420 = _Var13;
            if (_Var13 != (_Storage<slang::ConstantRange,_true>)0x0) {
              auVar9._8_8_ = 0;
              auVar9._0_8_ = _Var13;
              uVar22 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                       SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
              uVar14 = uVar22 >> (*(byte *)(lVar23 + 8) & 0x3f);
              uVar2 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[uVar22 & 0xff];
              uVar25 = 0;
              uVar24 = uVar14;
              do {
                pcVar1 = (char *)(*(long *)(lVar23 + 0x18) + uVar24 * 0x10);
                local_3a8 = *pcVar1;
                cStack_3a7 = pcVar1[1];
                cStack_3a6 = pcVar1[2];
                bStack_3a5 = pcVar1[3];
                cStack_3a4 = pcVar1[4];
                cStack_3a3 = pcVar1[5];
                cStack_3a2 = pcVar1[6];
                bStack_3a1 = pcVar1[7];
                cStack_3a0 = pcVar1[8];
                cStack_39f = pcVar1[9];
                cStack_39e = pcVar1[10];
                bStack_39d = pcVar1[0xb];
                cStack_39c = pcVar1[0xc];
                cStack_39b = pcVar1[0xd];
                cStack_39a = pcVar1[0xe];
                bStack_399 = pcVar1[0xf];
                cVar27 = (char)uVar2;
                auVar32[0] = -(local_3a8 == cVar27);
                cVar28 = (char)((uint)uVar2 >> 8);
                auVar32[1] = -(cStack_3a7 == cVar28);
                cVar29 = (char)((uint)uVar2 >> 0x10);
                auVar32[2] = -(cStack_3a6 == cVar29);
                bVar30 = (byte)((uint)uVar2 >> 0x18);
                auVar32[3] = -(bStack_3a5 == bVar30);
                auVar32[4] = -(cStack_3a4 == cVar27);
                auVar32[5] = -(cStack_3a3 == cVar28);
                auVar32[6] = -(cStack_3a2 == cVar29);
                auVar32[7] = -(bStack_3a1 == bVar30);
                auVar32[8] = -(cStack_3a0 == cVar27);
                auVar32[9] = -(cStack_39f == cVar28);
                auVar32[10] = -(cStack_39e == cVar29);
                auVar32[0xb] = -(bStack_39d == bVar30);
                auVar32[0xc] = -(cStack_39c == cVar27);
                auVar32[0xd] = -(cStack_39b == cVar28);
                auVar32[0xe] = -(cStack_39a == cVar29);
                auVar32[0xf] = -(bStack_399 == bVar30);
                uVar19 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe);
                if (uVar19 != 0) {
                  do {
                    iVar7 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                      }
                    }
                    if (_Var13 == *(_Storage<slang::ConstantRange,_true> *)
                                   (*(long *)(lVar23 + 0x20) + uVar24 * 0x1e0 +
                                   (ulong)(uint)(iVar7 << 5))) {
                      lVar21 = *(long *)(lVar23 + 0x20) + uVar24 * 0x1e0 + (ulong)(uint)(iVar7 << 5)
                      ;
                      goto LAB_0037489c;
                    }
                    uVar19 = uVar19 - 1 & uVar19;
                  } while (uVar19 != 0);
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7] & bStack_399) == 0
                   ) break;
                lVar21 = uVar24 + uVar25;
                uVar25 = uVar25 + 1;
                uVar24 = lVar21 + 1U & *(ulong *)(lVar23 + 0x10);
              } while (uVar25 <= *(ulong *)(lVar23 + 0x10));
              if (*(ulong *)(lVar23 + 0x30) < *(ulong *)(lVar23 + 0x28)) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
                          ((locator *)&local_440._M_value,local_410,(arrays_type *)local_410,uVar14,
                           uVar22,(try_emplace_args_t *)&local_428,(Symbol **)&local_420);
                *(long *)(lVar23 + 0x30) = *(long *)(lVar23 + 0x30) + 1;
                lVar21 = local_430;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
                          ((locator *)&local_440._M_value,local_410,uVar22,
                           (try_emplace_args_t *)&local_428,(Symbol **)&local_420);
                lVar21 = local_430;
              }
LAB_0037489c:
              _Var13 = (_Storage<slang::ConstantRange,_true>)local_380;
              oVar33 = Expression::evalSelector(this_00,(EvalContext *)_Var13,false);
              local_440 = oVar33.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::ConstantRange>._M_payload;
              local_438 = oVar33.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::ConstantRange>._M_engaged;
              puVar18 = *(undefined8 **)(lVar21 + 8);
              local_3d0 = *(undefined8 **)(lVar21 + 0x10);
              if (puVar18 != local_3d0) {
                local_3d8 = lVar21;
                bVar26 = false;
                do {
                  bVar10 = bVar26;
                  this_01 = (TimingPathSymbol *)*puVar18;
                  if (this_01->isResolved == false) {
                    resolve(this_01);
                  }
                  sVar3 = (this_01->outputs)._M_extent._M_extent_value;
                  local_3c8 = puVar18;
                  if (sVar3 != 0) {
                    ppEVar17 = (this_01->outputs)._M_ptr;
                    local_3b8 = ppEVar17 + sVar3;
                    do {
                      _Var20 = local_418;
                      this_02 = *ppEVar17;
                      _Var13 = (_Storage<slang::ConstantRange,_true>)0x1;
                      local_3b0 = ppEVar17;
                      _Var15 = (_Storage<slang::ConstantRange,_true>)
                               Expression::getSymbolReference(this_02,true);
                      if (_Var15 == _Var20) {
                        context = (EvalContext *)local_380;
                        oVar33 = Expression::evalSelector(this_02,context,false);
                        _Var13 = oVar33.super__Optional_base<slang::ConstantRange,_true,_true>.
                                 _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                 _M_payload;
                        bVar26 = (bool)local_450 ==
                                 oVar33.super__Optional_base<slang::ConstantRange,_true,_true>.
                                 _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                 _M_engaged;
                        _Var20._1_7_ = (undefined7)((ulong)context >> 8);
                        _Var20._0_1_ = bVar26 & local_450;
                        if (_Var20._0_1_ == 1) {
                          _Var20._0_4_ = local_458._M_value.left ^
                                         oVar33.
                                         super__Optional_base<slang::ConstantRange,_true,_true>.
                                         _M_payload.
                                         super__Optional_payload_base<slang::ConstantRange>.
                                         _M_payload._0_4_;
                          _Var20._M_value.right = 0;
                          bVar26 = oVar33.super__Optional_base<slang::ConstantRange,_true,_true>.
                                   _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                   _M_payload._4_4_ == local_458._M_value.right && _Var20._0_4_ == 0
                          ;
                        }
                        if (((local_450 == 0) ||
                            (((undefined1  [12])
                              oVar33.super__Optional_base<slang::ConstantRange,_true,_true>.
                              _M_payload.super__Optional_payload_base<slang::ConstantRange> &
                             (undefined1  [12])0x1) == (undefined1  [12])0x0)) ||
                           (bVar11 = ConstantRange::overlaps(&local_458._M_value,_Var13._M_value),
                           _Var20 = _Var13, bVar11)) {
                          _Var13 = _Var20;
                          if (this_01->isResolved == false) {
                            resolve(this_01);
                          }
                          sVar3 = (this_01->inputs)._M_extent._M_extent_value;
                          if (sVar3 != 0) {
                            ppEVar17 = (this_01->inputs)._M_ptr;
                            lVar23 = 0;
                            do {
                              _Var20 = local_420;
                              this_03 = *(Expression **)((long)ppEVar17 + lVar23);
                              _Var13 = (_Storage<slang::ConstantRange,_true>)0x1;
                              _Var15 = (_Storage<slang::ConstantRange,_true>)
                                       Expression::getSymbolReference(this_03,true);
                              if (_Var15 == _Var20) {
                                oVar33 = Expression::evalSelector
                                                   (this_03,(EvalContext *)local_380,false);
                                _Var13 = oVar33.
                                         super__Optional_base<slang::ConstantRange,_true,_true>.
                                         _M_payload.
                                         super__Optional_payload_base<slang::ConstantRange>.
                                         _M_payload;
                                bVar11 = (bool)local_438 ==
                                         oVar33.
                                         super__Optional_base<slang::ConstantRange,_true,_true>.
                                         _M_payload.
                                         super__Optional_payload_base<slang::ConstantRange>.
                                         _M_engaged;
                                _Var15 = (_Storage<slang::ConstantRange,_true>)
                                         (CONCAT71(_Var20._1_7_,bVar11 & local_438) & 0xffffffff);
                                if ((bVar11 & local_438) == 1) {
                                  _Var15._0_4_ = local_440._M_value.left ^
                                                 oVar33.
                                                 super__Optional_base<slang::ConstantRange,_true,_true>
                                                 ._M_payload.
                                                 super__Optional_payload_base<slang::ConstantRange>.
                                                 _M_payload._0_4_;
                                  _Var15._M_value.right = 0;
                                  bVar11 = oVar33.
                                           super__Optional_base<slang::ConstantRange,_true,_true>.
                                           _M_payload.
                                           super__Optional_payload_base<slang::ConstantRange>.
                                           _M_payload._4_4_ == local_440._M_value.right &&
                                           _Var15._0_4_ == 0;
                                }
                                if ((local_438 == 0) ||
                                   (((undefined1  [12])
                                     oVar33.super__Optional_base<slang::ConstantRange,_true,_true>.
                                     _M_payload.super__Optional_payload_base<slang::ConstantRange> &
                                    (undefined1  [12])0x1) == (undefined1  [12])0x0)) {
                                  if ((local_448 != this_02) ||
                                     (_Var13 = _Var15, this_00 != this_03)) goto LAB_00374a99;
                                }
                                else {
                                  bVar12 = ConstantRange::overlaps
                                                     (&local_440._M_value,_Var13._M_value);
                                  if ((this_00 != this_03 || local_448 != this_02) &&
                                     (_Var15 = _Var13, bVar12)) {
LAB_00374a99:
                                    if (!(bool)(bVar11 & bVar26)) goto LAB_00374b53;
                                    _Var13 = _Var15;
                                    if (this->edgeIdentifier == this_01->edgeIdentifier) {
                                      if (this->isResolved == false) {
                                        resolve(this);
                                      }
                                      pEVar4 = this->conditionExpr;
                                      if (this_01->isResolved == false) {
                                        resolve(this_01);
                                      }
                                      pEVar5 = this_01->conditionExpr;
                                      _Var13 = _Var15;
                                      if (this->isStateDependent == this_01->isStateDependent) {
                                        if ((this->isStateDependent == false) ||
                                           (((pEVar5 != (Expression *)0x0) ==
                                             (pEVar4 != (Expression *)0x0) &&
                                            ((((pEVar4 == (Expression *)0x0 ||
                                               (pEVar5 == (Expression *)0x0)) ||
                                              (&pEVar4->syntax->super_SyntaxNode ==
                                               (SyntaxNode *)0x0)) ||
                                             ((_Var13 = (_Storage<slang::ConstantRange,_true>)
                                                        pEVar5->syntax,
                                              _Var13 == (_Storage<slang::ConstantRange,_true>)0x0 ||
                                              (bVar11 = slang::syntax::SyntaxNode::isEquivalentTo
                                                                  (&pEVar4->syntax->super_SyntaxNode
                                                                   ,(SyntaxNode *)_Var13), bVar11)))
                                             ))))) {
LAB_00374b53:
                                          pDVar16 = Scope::addDiag(local_3c0,(DiagCode)0xec0006,
                                                                   this_00->sourceRange);
                                          pDVar16 = Diagnostic::operator<<
                                                              (pDVar16,local_448->sourceRange);
                                          pDVar16 = Diagnostic::addNote(pDVar16,(DiagCode)0xa0001,
                                                                        this_03->sourceRange);
                                          _Var13 = *(_Storage<slang::ConstantRange,_true> *)
                                                    &(this_02->sourceRange).startLoc;
                                          Diagnostic::operator<<(pDVar16,this_02->sourceRange);
                                        }
                                      }
                                      else if (pEVar4 == (Expression *)0x0 &&
                                               pEVar5 == (Expression *)0x0) goto LAB_00374b53;
                                    }
                                  }
                                }
                              }
                              lVar23 = lVar23 + 8;
                            } while (sVar3 << 3 != lVar23);
                          }
                        }
                      }
                      ppEVar17 = local_3b0 + 1;
                    } while (ppEVar17 != local_3b8);
                  }
                  puVar18 = local_3c8 + 1;
                  bVar26 = (bool)(bVar10 | this_01 == this);
                } while (puVar18 != local_3d0);
                timingPathMap = (TimingPathMap *)local_3e8;
                lVar21 = local_3d8;
                lVar23 = local_3e0;
                if (bVar10 || this_01 == this) goto LAB_00374c17;
              }
              _Var13 = (_Storage<slang::ConstantRange,_true>)&local_428;
              local_428 = this;
              std::
              vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>
              ::emplace_back<slang::ast::TimingPathSymbol_const*>
                        ((vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>
                          *)(lVar21 + 8),(TimingPathSymbol **)_Var13);
            }
LAB_00374c17:
            ppEVar17 = local_3f0 + 1;
          } while (ppEVar17 != local_3f8);
        }
      }
      ppEVar17 = local_400 + 1;
    } while (ppEVar17 != local_408);
  }
  SmallVectorBase<slang::Diagnostic>::cleanup(&local_140,(EVP_PKEY_CTX *)_Var13);
  SmallVectorBase<slang::Diagnostic>::cleanup(&local_238,(EVP_PKEY_CTX *)_Var13);
  if (local_278 != local_260) {
    operator_delete(local_278);
  }
  SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup(&local_330,(EVP_PKEY_CTX *)_Var13);
  return;
}

Assistant:

void TimingPathSymbol::checkDuplicatePaths(TimingPathMap& timingPathMap) const {
    auto parent = getParentScope();
    SLANG_ASSERT(parent);

    EvalContext evalCtx(ASTContext(*parent, LookupLocation::max), EvalFlags::CacheResults);

    auto terminalOverlaps = [&](const Symbol& ourTerminal,
                                const std::optional<ConstantRange>& ourRange,
                                const Expression& otherExpr, bool& identicalRanges) {
        if (otherExpr.getSymbolReference() != &ourTerminal)
            return false;

        auto otherRange = otherExpr.evalSelector(evalCtx, /* enforceBounds */ false);
        identicalRanges = ourRange == otherRange;
        return !ourRange || !otherRange || ourRange->overlaps(*otherRange);
    };

    auto checkDup = [&](const TimingPathSymbol& otherPath, bool identicalRanges,
                        const Expression& inputExpr, const Expression& outputExpr,
                        const Expression& otherInputExpr, const Expression& otherOutputExpr) {
        // If these are literally the same path then it's not a dup, it's just ourselves.
        if (&inputExpr == &otherInputExpr && &outputExpr == &otherOutputExpr)
            return;

        // We've determined that our path and the `otherPath` have overlapping
        // source and dest terminals. If ranges are identical then we may not
        // have a dup, so check further.
        if (identicalRanges) {
            // If the paths have unique edges then they aren't dups.
            if (edgeIdentifier != otherPath.edgeIdentifier)
                return;

            // If one is conditional and the other is not, it's not a dup
            // unless the conditional one is also an ifnone condition.
            auto cond = getConditionExpr();
            auto otherCond = otherPath.getConditionExpr();
            if (isStateDependent != otherPath.isStateDependent) {
                if (cond || otherCond)
                    return;
            }
            else if (isStateDependent && otherPath.isStateDependent) {
                // If one is ifnone and the other is not, then not a dup.
                if ((!cond || !otherCond) && (cond || otherCond))
                    return;

                // If both are ifnone then there's a dup, otherwise check further.
                if (cond && otherCond) {
                    // If the condition makes this unique then it's not a dup.
                    // The LRM doesn't specify what it means for the condition expression
                    // to be unique; we check here at the syntactical level rather than
                    // the AST level.
                    auto lsyntax = cond->syntax;
                    auto rsyntax = otherCond->syntax;
                    if (lsyntax && rsyntax && !lsyntax->isEquivalentTo(*rsyntax))
                        return;
                }
            }
        }

        // Otherwise we've definitely found a dup, so issue a diagnostic.
        auto& diag = parent->addDiag(diag::DupTimingPath, inputExpr.sourceRange)
                     << outputExpr.sourceRange;
        diag.addNote(diag::NotePreviousDefinition, otherInputExpr.sourceRange)
            << otherOutputExpr.sourceRange;
    };

    for (auto outputExpr : getOutputs()) {
        if (auto output = outputExpr->getSymbolReference()) {
            // Find all paths that map to this output.
            auto& inputMap = timingPathMap[output];
            auto outputRange = outputExpr->evalSelector(evalCtx, /* enforceBounds */ false);

            for (auto inputExpr : getInputs()) {
                if (auto input = inputExpr->getSymbolReference()) {
                    // Find all paths that also map to this input.
                    auto& vec = inputMap[input];
                    auto inputRange = inputExpr->evalSelector(evalCtx, /* enforceBounds */ false);

                    // Look at each existing path and determine whether it's a duplicate.
                    bool alreadyAdded = false;
                    for (auto path : vec) {
                        for (auto otherOutputExpr : path->getOutputs()) {
                            // Only a dup if the output terminals overlap.
                            bool outputRangeIdentical;
                            if (terminalOverlaps(*output, outputRange, *otherOutputExpr,
                                                 outputRangeIdentical)) {
                                for (auto otherInputExpr : path->getInputs()) {
                                    // Only a dup if the input terminals overlap.
                                    bool inputRangeIdentical;
                                    if (terminalOverlaps(*input, inputRange, *otherInputExpr,
                                                         inputRangeIdentical)) {
                                        checkDup(*path, outputRangeIdentical && inputRangeIdentical,
                                                 *inputExpr, *outputExpr, *otherInputExpr,
                                                 *otherOutputExpr);
                                    }
                                }
                            }
                        }

                        // It's possible that *this* path can already be in the list,
                        // since you can have a declaration like this:
                        // (a[0], a[1] *> b) = 1
                        if (path == this)
                            alreadyAdded = true;
                    }

                    if (!alreadyAdded)
                        vec.push_back(this);
                }
            }
        }
    }
}